

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O3

bool DirectiveDefineLabel(ArgumentList *List,int flags)

{
  bool bVar1;
  undefined8 in_RAX;
  CAssemblerLabel *this;
  pointer pEVar2;
  wchar_t *text;
  int value;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  bVar1 = ConvertExpression(&(List->entries).
                             super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].text,(int *)&local_14);
  pEVar2 = (List->entries).
           super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar1) {
    bVar1 = SymbolTable::isValidSymbolName(&pEVar2->text);
    if (bVar1) {
      this = (CAssemblerLabel *)operator_new(0x48);
      CAssemblerLabel::CAssemblerLabel
                (this,&((List->entries).
                        super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_start)->text,(ulong)local_14,
                 Global.Section,true);
      AddAssemblerCommand((CAssemblerCommand *)0x13c970);
      return true;
    }
    pEVar2 = (List->entries).
             super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    text = L"Invalid label name \"%s\"";
  }
  else {
    pEVar2 = pEVar2 + 1;
    text = L"Invalid expression \"%s\"";
  }
  Logger::printError<std::__cxx11::wstring>(Error,text,&pEVar2->text);
  return false;
}

Assistant:

bool DirectiveDefineLabel(ArgumentList& List, int flags)
{
	int value;
	CAssemblerLabel* labelCommand;

	if (ConvertExpression(List[1].text,value) == false)
	{
		Logger::printError(Logger::Error,L"Invalid expression \"%s\"",List[1].text);
		return false;
	}
	
	if (Global.symbolTable.isValidSymbolName(List[0].text) == false)
	{
		Logger::printError(Logger::Error,L"Invalid label name \"%s\"",List[0].text);
		return false;
	}

	labelCommand = new CAssemblerLabel(List[0].text, (u32) value, Global.Section, true);
	AddAssemblerCommand(labelCommand);
	return true;
}